

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sarimaxtest2.c
# Opt level: O3

int main(void)

{
  int iVar1;
  double *xpred;
  double *amse;
  FILE *__stream;
  double *pdVar2;
  sarimax_object obj;
  long lVar3;
  uint N;
  ulong uVar4;
  double dVar5;
  double local_25b8;
  double temp [1200];
  
  xpred = (double *)malloc(0x28);
  amse = (double *)malloc(0x28);
  __stream = fopen("../data/seriesG.txt","r");
  if (__stream == (FILE *)0x0) {
    printf("Cannot Open File");
    exit(100);
  }
  iVar1 = feof(__stream);
  if (iVar1 == 0) {
    pdVar2 = &local_25b8;
    N = 0;
    temp[0x4af] = (double)xpred;
    do {
      __isoc99_fscanf(__stream,"%lf \n",pdVar2);
      N = N + 1;
      iVar1 = feof(__stream);
      pdVar2 = pdVar2 + 1;
    } while (iVar1 == 0);
    pdVar2 = (double *)malloc((ulong)N * 8);
    uVar4 = 0;
    do {
      dVar5 = log(temp[uVar4 - 1]);
      pdVar2[uVar4] = dVar5;
      uVar4 = uVar4 + 1;
      xpred = (double *)temp[0x4af];
    } while (N != uVar4);
  }
  else {
    N = 0;
    pdVar2 = (double *)malloc(0);
  }
  obj = sarimax_init(2,1,2,1,1,1,0xc,0,1,N);
  sarimax_setMethod(obj,2);
  lVar3 = 0;
  sarimax_exec(obj,pdVar2,(double *)0x0);
  sarimax_summary(obj);
  temp[0x4af] = (double)obj;
  sarimax_predict(obj,pdVar2,(double *)0x0,5,(double *)0x0,xpred,amse);
  putchar(10);
  printf("Predicted Values : ");
  do {
    exp(xpred[lVar3]);
    printf("%g ");
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  putchar(10);
  lVar3 = 0;
  printf("Standard Errors  : ");
  do {
    dVar5 = amse[lVar3];
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    printf("%g ",dVar5);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  putchar(10);
  sarimax_free((sarimax_object)temp[0x4af]);
  free(pdVar2);
  free(xpred);
  free(amse);
  return 0;
}

Assistant:

int main(void) {
	int i, N, d, D, L;
	double *inp;
	int p, q, P, Q, s, r;
	double *phi, *theta;
    double *PHI, *THETA;
	double *xpred, *amse;
	sarimax_object obj;
	int imean = 1;
    /*
    Make sure all the parameter values are correct and consistent with other values. eg., if xreg is NULL r should be 0
    or if P = D = Q = 0 then make sure that s is also 0. 
     Recheck the values if the program fails to execute.
    */
	p = 2;
	d = 1;
	q = 2;
	s = 12;
	P = 1;
	D = 1;
	Q = 1;
	r = 0;


	L = 5;

	phi = (double*)malloc(sizeof(double)* p);
	theta = (double*)malloc(sizeof(double)* q);
    PHI = (double*)malloc(sizeof(double)* P);
	THETA = (double*)malloc(sizeof(double)* Q);

	xpred = (double*)malloc(sizeof(double)* L);
	amse = (double*)malloc(sizeof(double)* L);

	FILE *ifp;
	double temp[1200];

	ifp = fopen("../data/seriesG.txt", "r");
	i = 0;
	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf \n", &temp[i]);
		i++;
	}
	N = i;

	inp = (double*)malloc(sizeof(double)* N);

    /*
    
    */

	for (i = 0; i < N; ++i) {
		inp[i] = log(temp[i]);
	}


	obj = sarimax_init(p, d, q, P, D, Q, s, r ,imean, N);

    /* setMethod()
    Method 0 ("CSS-MLE") is default. The method also accepts values 1 ("MLE") and 2 ("CSS")
    */

	sarimax_setMethod(obj, 2); 

    /*sarimax_exec(object, input time series, exogenous time series)
        set exogenous to NULL if deadling only with a univariate time series.
    */
	sarimax_exec(obj, inp,NULL);
	sarimax_summary(obj);
	/* sarimax_predict(sarimax_object obj, double *inp, double *xreg, int L,double *newxreg, double *xpred, double *amse)
        inp - Input Time Series
        xreg - Exogenous Time Series
        L - L point prediction
        newxreg - Exogenous Time Series of dimension r * L where r is the number of exogenus time series and L is the length of each
        xpred - L future values
        amse - MSE for L future values
    */
	sarimax_predict(obj, inp, NULL, L, NULL, xpred, amse);
	printf("\n");
	printf("Predicted Values : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", exp(xpred[i]));
	}
	printf("\n");
	printf("Standard Errors  : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", sqrt(amse[i]));
	}
	printf("\n");
	sarimax_free(obj);
	free(inp);
	free(phi);
	free(theta);
    free(PHI);
	free(THETA);
	free(xpred);
	free(amse);
	return 0;

}